

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O2

int timer_less_than(heap_node *ha,heap_node *hb)

{
  uint uVar1;
  
  if (ha[1].left < hb[1].left) {
    return 1;
  }
  uVar1 = 0;
  if (ha[1].left <= hb[1].left) {
    uVar1 = (uint)(ha[1].parent < hb[1].parent);
  }
  return uVar1;
}

Assistant:

static int timer_less_than(const struct heap_node* ha,
                           const struct heap_node* hb) {
  const uv_timer_t* a;
  const uv_timer_t* b;

  a = container_of(ha, uv_timer_t, heap_node);
  b = container_of(hb, uv_timer_t, heap_node);

  if (a->timeout < b->timeout)
    return 1;
  if (b->timeout < a->timeout)
    return 0;

  /* Compare start_id when both have the same timeout. start_id is
   * allocated with loop->timer_counter in uv_timer_start().
   */
  return a->start_id < b->start_id;
}